

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O2

Arguments * __thiscall Corrade::Utility::Arguments::addArrayArgument(Arguments *this,string *key)

{
  Entry *pEVar1;
  Debug *pDVar2;
  ostream *poVar3;
  string helpKey;
  undefined1 local_72;
  undefined1 local_71;
  Error local_70;
  size_t local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  if ((this->_prefix)._M_string_length == 0) {
    if (key->_M_string_length == 0) {
      poVar3 = Error::defaultOutput();
      Error::Error(&local_70,poVar3,(Flags)0x0);
      Debug::operator<<(&local_70.super_Debug,
                        "Utility::Arguments::addArrayArgument(): key can\'t be empty");
    }
    else {
      pEVar1 = find(this,key);
      if (pEVar1 == (Entry *)0x0) {
        if (this->_arrayArgument == 0) {
          if (this->_finalOptionalArgument == 0) {
            (this->_flags)._value = (this->_flags)._value & 0x7f;
            this->_arrayArgument = (uint16_t)(this->_entries)._size;
            std::__cxx11::string::string((string *)&local_70,(string *)key);
            local_71 = 1;
            local_72 = 0;
            local_40 = local_30;
            local_38 = 0;
            local_30[0] = 0;
            local_48 = (this->_arrayValues)._size;
            Containers::
            arrayAppend<Corrade::Utility::Arguments::Entry,Corrade::Containers::ArrayNewAllocator<Corrade::Utility::Arguments::Entry>,Corrade::Utility::Arguments::Type,char,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long>
                      (&this->_entries,&local_71,&local_72,key,&local_70,&local_40,&local_48);
            std::__cxx11::string::~string((string *)&local_40);
            Containers::
            arrayAppend<Corrade::Containers::Array<std::__cxx11::string,void(*)(std::__cxx11::string*,unsigned_long)>,Corrade::Containers::ArrayNewAllocator<Corrade::Containers::Array<std::__cxx11::string,void(*)(std::__cxx11::string*,unsigned_long)>>>
                      (&this->_arrayValues);
            std::__cxx11::string::~string((string *)&local_70);
            return this;
          }
          poVar3 = Error::defaultOutput();
          Error::Error(&local_70,poVar3,(Flags)0x0);
          Debug::operator<<(&local_70.super_Debug,
                            "Utility::Arguments::addArrayArgument(): can\'t add more arguments after the final optional one"
                           );
        }
        else {
          poVar3 = Error::defaultOutput();
          Error::Error(&local_70,poVar3,(Flags)0x0);
          pDVar2 = Debug::operator<<(&local_70.super_Debug,
                                     "Utility::Arguments::addArrayArgument(): there\'s already an array argument"
                                    );
          pEVar1 = Containers::
                   Array<Corrade::Utility::Arguments::Entry,_void_(*)(Corrade::Utility::Arguments::Entry_*,_unsigned_long)>
                   ::operator[]<unsigned_short,_0>(&this->_entries,this->_arrayArgument);
          operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (pDVar2,&pEVar1->key);
        }
      }
      else {
        poVar3 = Error::defaultOutput();
        Error::Error(&local_70,poVar3,(Flags)0x0);
        pDVar2 = Debug::operator<<(&local_70.super_Debug,
                                   "Utility::Arguments::addArrayArgument(): the key");
        pDVar2 = Implementation::debugPrintStlString(pDVar2,key);
        Debug::operator<<(pDVar2,"is already used");
      }
    }
  }
  else {
    poVar3 = Error::defaultOutput();
    Error::Error(&local_70,poVar3,(Flags)0x0);
    pDVar2 = Debug::operator<<(&local_70.super_Debug,
                               "Utility::Arguments::addArrayArgument(): argument");
    pDVar2 = Implementation::debugPrintStlString(pDVar2,key);
    Debug::operator<<(pDVar2,"not allowed in prefixed version");
  }
  Error::~Error(&local_70);
  abort();
}

Assistant:

Arguments& Arguments::addArrayArgument(std::string key) {
    CORRADE_ASSERT(_prefix.empty(),
        "Utility::Arguments::addArrayArgument(): argument" << key << "not allowed in prefixed version", *this);
    CORRADE_ASSERT(!key.empty(),
        "Utility::Arguments::addArrayArgument(): key can't be empty", *this);
    CORRADE_ASSERT(!find(key),
        "Utility::Arguments::addArrayArgument(): the key" << key << "is already used", *this);

    /* There can be only one array argument and thre can't be both an array
       argument and a final optional argument, as otherwise we would have no
       way to know what is what */
    CORRADE_ASSERT(!_arrayArgument,
        "Utility::Arguments::addArrayArgument(): there's already an array argument" << _entries[_arrayArgument].key, *this);
    CORRADE_ASSERT(!_finalOptionalArgument,
        "Utility::Arguments::addArrayArgument(): can't add more arguments after the final optional one", *this);

    /* Reset the parsed flag -- it's probably a mistake to add an argument and
       then ask for values without parsing again */
    _flags &= ~InternalFlag::Parsed;

    _arrayArgument = _entries.size();
    std::string helpKey = key;
    arrayAppend(_entries, InPlaceInit, Type::ArrayArgument, '\0', std::move(key), std::move(helpKey), std::string(), _arrayValues.size());
    arrayAppend(_arrayValues, InPlaceInit);
    return *this;
}